

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O0

int SetPulsePololu(POLOLU *pPololu,int channel,int duration)

{
  int iVar1;
  int duration_local;
  int channel_local;
  POLOLU *pPololu_local;
  
  iVar1 = SetPWMPololu(pPololu,channel,2000);
  if (iVar1 == 0) {
    mSleep((long)(duration / 1000));
    iVar1 = SetPWMPololu(pPololu,channel,1000);
    if (iVar1 == 0) {
      pPololu_local._4_4_ = 0;
    }
    else {
      pPololu_local._4_4_ = 1;
    }
  }
  else {
    pPololu_local._4_4_ = 1;
  }
  return pPololu_local._4_4_;
}

Assistant:

inline int SetPulsePololu(POLOLU* pPololu, int channel, int duration)
{
	if (SetPWMPololu(pPololu, channel, 2000) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	mSleep(duration/1000);
	if (SetPWMPololu(pPololu, channel, 1000) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}

	return EXIT_SUCCESS;
}